

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  uint x;
  uint y;
  uint uVar7;
  stbi_uc *psVar8;
  stbi_uc *psVar9;
  uchar *puVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  byte *pbVar15;
  stbi_uc *psVar16;
  int *piVar17;
  uint uVar18;
  byte bVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  byte bVar23;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  uint local_d4;
  stbi_uc local_c0 [4];
  int local_bc;
  stbi_uc *local_b8;
  uchar *local_b0;
  int *local_a8;
  stbi_uc *local_a0;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  psVar1 = s->buffer_start;
  psVar2 = s->buffer_start + 1;
  psVar16 = s->img_buffer;
  psVar9 = s->img_buffer_end;
  iVar13 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    if (psVar16 < psVar9) {
      psVar16 = psVar16 + 1;
LAB_0017023d:
      s->img_buffer = psVar16;
    }
    else if (s->read_from_callbacks != 0) {
      iVar21 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar21 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        psVar9 = psVar2;
      }
      else {
        psVar9 = psVar1 + iVar21;
      }
      s->img_buffer_end = psVar9;
      psVar16 = psVar2;
      goto LAB_0017023d;
    }
    iVar13 = iVar13 + -1;
  } while (iVar13 != 0);
  x = stbi__get16be(s);
  y = stbi__get16be(s);
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar13 = (*(s->io).eof)(s->io_user_data);
    if (iVar13 == 0) goto LAB_0017028b;
    if (s->read_from_callbacks == 0) goto LAB_001702d8;
  }
  if (s->img_buffer_end <= s->img_buffer) {
LAB_001702d8:
    stbi__g_failure_reason = "bad file";
    return (void *)0x0;
  }
LAB_0017028b:
  bVar20 = 0;
  uVar14 = 0;
  if ((y != 0) && (uVar14 = y * x, 0x1fffffff < uVar14 || (uint)(0x7fffffff / (ulong)y) < x)) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_bc = req_comp;
  local_a8 = comp;
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  stbi__get16be(s);
  local_b0 = (uchar *)stbi__malloc_mad3(x,y,4,0);
  memset(local_b0,0xff,(ulong)(uVar14 << 2));
  pbVar15 = (byte *)(local_57 + 1);
  lVar22 = 0;
  local_a0 = psVar2;
  do {
    psVar2 = local_a0;
    if (lVar22 == 10) {
LAB_0017093c:
      stbi__g_failure_reason = "bad format";
      goto LAB_00170966;
    }
    psVar16 = s->img_buffer;
    psVar9 = s->img_buffer_end;
    if (psVar16 < psVar9) {
      s->img_buffer = psVar16 + 1;
      bVar3 = *psVar16;
      psVar16 = psVar16 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar3 = 0;
    }
    else {
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar3 = 0;
        psVar9 = psVar2;
      }
      else {
        bVar3 = *psVar1;
        psVar9 = psVar1 + iVar13;
      }
      s->img_buffer_end = psVar9;
      s->img_buffer = psVar2;
      psVar16 = psVar2;
    }
    local_98 = lVar22;
    if (psVar16 < psVar9) {
      s->img_buffer = psVar16 + 1;
      bVar19 = *psVar16;
      psVar16 = psVar16 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar19 = 0;
    }
    else {
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar19 = 0;
        psVar9 = psVar2;
      }
      else {
        bVar19 = *psVar1;
        psVar9 = psVar1 + iVar13;
      }
      s->img_buffer_end = psVar9;
      s->img_buffer = psVar2;
      psVar16 = psVar2;
    }
    pbVar15[-2] = bVar19;
    if (psVar16 < psVar9) {
      s->img_buffer = psVar16 + 1;
      bVar23 = *psVar16;
      psVar16 = psVar16 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar23 = 0;
    }
    else {
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar23 = 0;
        psVar9 = psVar2;
      }
      else {
        bVar23 = *psVar1;
        psVar9 = psVar1 + iVar13;
      }
      s->img_buffer_end = psVar9;
      s->img_buffer = psVar2;
      psVar16 = psVar2;
    }
    pbVar15[-1] = bVar23;
    if (psVar16 < psVar9) {
      s->img_buffer = psVar16 + 1;
      bVar23 = *psVar16;
      psVar16 = psVar16 + 1;
    }
    else if (s->read_from_callbacks == 0) {
      bVar23 = 0;
    }
    else {
      iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
      if (iVar13 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar23 = 0;
        psVar9 = local_a0;
      }
      else {
        bVar23 = *psVar1;
        psVar9 = psVar1 + iVar13;
      }
      s->img_buffer_end = psVar9;
      s->img_buffer = local_a0;
      psVar16 = local_a0;
    }
    *pbVar15 = bVar23;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00170545:
      if (psVar9 <= psVar16) {
LAB_00170945:
        stbi__g_failure_reason = "bad file";
        goto LAB_00170966;
      }
    }
    else {
      iVar13 = (*(s->io).eof)(s->io_user_data);
      if (iVar13 != 0) {
        if (s->read_from_callbacks != 0) {
          psVar16 = s->img_buffer;
          psVar9 = s->img_buffer_end;
          goto LAB_00170545;
        }
        goto LAB_00170945;
      }
    }
    psVar2 = local_a0;
    if (bVar19 != 8) goto LAB_0017093c;
    bVar20 = bVar20 | bVar23;
    pbVar15 = pbVar15 + 3;
    lVar22 = local_98 + 1;
  } while (bVar3 != 0);
  local_84 = 4 - (uint)((bVar20 & 0x10) == 0);
  if (local_a8 != (int *)0x0) {
    *local_a8 = local_84;
  }
  if (y != 0) {
    local_88 = x * 4;
    local_80 = (ulong)y;
    uVar12 = 0;
    local_98 = lVar22;
    do {
      local_b8 = local_b0 + local_88 * (int)uVar12;
      lVar22 = 0;
      local_78 = uVar12;
      do {
        lVar6 = lVar22 * 3;
        cVar4 = local_57[lVar6];
        local_70 = lVar22;
        if (cVar4 == '\0') {
          if (x != 0) {
            bVar20 = local_57[lVar6 + 1];
            psVar16 = local_b8;
            uVar14 = x;
            do {
              psVar9 = stbi__readval(s,(uint)bVar20,psVar16);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_00170966;
              psVar16 = psVar16 + 4;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
        }
        else if (cVar4 == '\x01') {
          psVar16 = local_b8;
          uVar14 = x;
          if (x != 0) {
            do {
              psVar9 = s->img_buffer;
              psVar8 = s->img_buffer_end;
              if (psVar9 < psVar8) {
                s->img_buffer = psVar9 + 1;
                local_d4 = (uint)*psVar9;
                psVar9 = psVar9 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                local_d4 = 0;
              }
              else {
                iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                if (iVar13 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  local_d4 = 0;
                  psVar8 = psVar2;
                }
                else {
                  local_d4 = (uint)*psVar1;
                  psVar8 = psVar1 + iVar13;
                }
                s->img_buffer_end = psVar8;
                s->img_buffer = psVar2;
                psVar9 = psVar2;
              }
              if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00170853:
                if (psVar8 <= psVar9) goto LAB_001709bd;
              }
              else {
                iVar13 = (*(s->io).eof)(s->io_user_data);
                if (iVar13 != 0) {
                  if (s->read_from_callbacks != 0) {
                    psVar9 = s->img_buffer;
                    psVar8 = s->img_buffer_end;
                    goto LAB_00170853;
                  }
                  goto LAB_001709bd;
                }
              }
              psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_c0);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_00170966;
              if (uVar14 < local_d4) {
                local_d4 = uVar14;
              }
              uVar7 = local_d4 & 0xff;
              if ((char)local_d4 != '\0') {
                uVar11 = 0;
                do {
                  bVar20 = local_57[lVar6 + 1];
                  uVar18 = 0x80;
                  lVar22 = 0;
                  do {
                    if ((uVar18 & bVar20) != 0) {
                      psVar16[lVar22] = local_c0[lVar22];
                    }
                    lVar22 = lVar22 + 1;
                    uVar18 = uVar18 >> 1;
                  } while (lVar22 != 4);
                  uVar11 = uVar11 + 1;
                  psVar16 = psVar16 + 4;
                } while (uVar11 != uVar7);
              }
              uVar11 = uVar14 - uVar7;
              bVar5 = (int)uVar7 <= (int)uVar14;
              uVar14 = uVar11;
            } while (uVar11 != 0 && bVar5);
          }
        }
        else {
          if (cVar4 != '\x02') {
            stbi__g_failure_reason = "bad format";
            goto LAB_00170966;
          }
          psVar16 = local_b8;
          local_d4 = x;
          if (x != 0) {
LAB_00170620:
            psVar9 = s->img_buffer;
            psVar8 = s->img_buffer_end;
            if (psVar9 < psVar8) {
              s->img_buffer = psVar9 + 1;
              bVar20 = *psVar9;
              psVar9 = psVar9 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              bVar20 = 0;
            }
            else {
              iVar13 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
              if (iVar13 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar20 = 0;
                psVar8 = psVar2;
              }
              else {
                bVar20 = *psVar1;
                psVar8 = psVar1 + iVar13;
              }
              s->img_buffer_end = psVar8;
              s->img_buffer = psVar2;
              psVar9 = psVar2;
            }
            if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001706bf:
              if (psVar8 <= psVar9) goto LAB_001709bd;
            }
            else {
              iVar13 = (*(s->io).eof)(s->io_user_data);
              if (iVar13 != 0) {
                if (s->read_from_callbacks != 0) {
                  psVar9 = s->img_buffer;
                  psVar8 = s->img_buffer_end;
                  goto LAB_001706bf;
                }
LAB_001709bd:
                stbi__g_failure_reason = "bad file";
                goto LAB_00170966;
              }
            }
            uVar14 = (uint)bVar20;
            if ((char)bVar20 < '\0') {
              if (uVar14 == 0x80) {
                iVar13 = stbi__get16be(s);
              }
              else {
                iVar13 = uVar14 - 0x7f;
              }
              if ((int)local_d4 < iVar13) goto LAB_001709bd;
              psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],local_c0);
              if (psVar9 == (stbi_uc *)0x0) goto LAB_00170966;
              if (0 < iVar13) {
                iVar21 = 0;
                do {
                  bVar20 = local_57[lVar6 + 1];
                  uVar14 = 0x80;
                  lVar22 = 0;
                  do {
                    if ((uVar14 & bVar20) != 0) {
                      psVar16[lVar22] = local_c0[lVar22];
                    }
                    lVar22 = lVar22 + 1;
                    uVar14 = uVar14 >> 1;
                  } while (lVar22 != 4);
                  iVar21 = iVar21 + 1;
                  psVar16 = psVar16 + 4;
                } while (iVar21 != iVar13);
              }
            }
            else {
              iVar21 = bVar20 + 1;
              local_8c = iVar21;
              if (local_d4 <= uVar14) goto LAB_001709bd;
              do {
                psVar9 = stbi__readval(s,(uint)(byte)local_57[lVar6 + 1],psVar16);
                if (psVar9 == (stbi_uc *)0x0) goto LAB_00170966;
                psVar16 = psVar16 + 4;
                iVar21 = iVar21 + -1;
                iVar13 = local_8c;
              } while (iVar21 != 0);
            }
            uVar14 = local_d4 - iVar13;
            bVar5 = (int)local_d4 < iVar13;
            local_d4 = uVar14;
            if (uVar14 == 0 || bVar5) goto LAB_001708f3;
            goto LAB_00170620;
          }
        }
LAB_001708f3:
        lVar22 = local_70 + 1;
      } while (local_98 != lVar22);
      uVar12 = local_78 + 1;
    } while (uVar12 != local_80);
  }
  piVar17 = local_a8;
  puVar10 = local_b0;
  iVar13 = local_bc;
  if (local_b0 == (uchar *)0x0) {
LAB_00170966:
    piVar17 = local_a8;
    iVar13 = local_bc;
    free(local_b0);
    puVar10 = (uchar *)0x0;
  }
  *local_68 = x;
  *local_60 = y;
  iVar21 = local_84;
  if (iVar13 != 0) {
    iVar21 = iVar13;
  }
  if (iVar13 == 0 && piVar17 != (int *)0x0) {
    iVar21 = *piVar17;
  }
  puVar10 = stbi__convert_format(puVar10,4,iVar21,x,y);
  return puVar10;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}